

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O0

void throwOnWrongMessage(StatsdServer *server,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  string actual;
  string *expected_local;
  StatsdServer *server_local;
  
  Statsd::StatsdServer::receive_abi_cxx11_((StatsdServer *)&stack0xffffffffffffffc8);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffffc8,expected);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Expected: ");
  poVar2 = std::operator<<(poVar2,(string *)expected);
  poVar2 = std::operator<<(poVar2," but got: ");
  poVar2 = std::operator<<(poVar2,(string *)&stack0xffffffffffffffc8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Incorrect stat received");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwOnWrongMessage(StatsdServer& server, const std::string& expected) {
    auto actual = server.receive();
    if (actual != expected) {
        std::cerr << "Expected: " << expected << " but got: " << actual << std::endl;
        throw std::runtime_error("Incorrect stat received");
    }
}